

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

word zzAdd(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  word wVar3;
  ulong uVar4;
  size_t sVar5;
  
  wVar3 = 0;
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    uVar1 = a[sVar5];
    uVar4 = wVar3 + a[sVar5];
    uVar2 = b[sVar5];
    c[sVar5] = uVar4 + b[sVar5];
    wVar3 = (word)(CARRY8(uVar4,uVar2) || CARRY8(wVar3,uVar1));
  }
  return wVar3;
}

Assistant:

word zzAdd(word c[], const word a[], const word b[], size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		c[i] = w + b[i];
		carry |= wordLess01(c[i], w);
#else
		w = a[i] + carry;
		if (w < carry)
			c[i] = b[i];
		else
			w += b[i], carry = w < b[i], c[i] = w;
#endif
	}
	w = 0;
	return carry;
}